

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O3

int input_intelhex(char *fname,int *start,int *length)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  ulong uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  int lval;
  int ladr;
  int ll;
  int lt;
  uint local_60;
  uint local_5c;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  uint *local_40;
  int *local_38;
  
  __stream = fopen(fname,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    local_60 = 0x8000;
    local_58 = 0;
    local_38 = length;
    do {
      do {
        do {
          memset(sline,0,0x100);
          iVar1 = fgetc(__stream);
          uVar3 = 0;
          do {
            if (iVar1 == -1) goto LAB_00102549;
            if (iVar1 == 10) {
              bVar6 = uVar3 < 0xb;
              goto LAB_00102402;
            }
            sline[uVar3] = (char)iVar1;
            uVar3 = uVar3 + 1;
            iVar1 = fgetc(__stream);
          } while (uVar3 != 0xff);
          if (iVar1 == -1) {
LAB_00102549:
            *local_38 = local_58;
            *start = local_60;
            iVar1 = 1;
            goto LAB_00102560;
          }
          bVar6 = false;
LAB_00102402:
          if ((bVar6) || (sline[0] != ':')) {
            __s = "Invalid Intel Hex format.";
            goto LAB_00102584;
          }
          iVar1 = __isoc99_sscanf(sline,":%2x%4x%2x",&local_50,&local_54,&local_4c);
        } while (iVar1 != 3);
      } while ((0x8000 < (int)(local_54 + local_50)) || (local_4c != 0));
      iVar1 = local_54 + local_50 + ((int)local_54 >> 8);
      if ((int)local_54 < (int)local_60) {
        local_60 = local_54;
      }
      if (local_50 < 1) {
        lVar4 = 9;
        local_48 = (ulong)local_54;
      }
      else {
        iVar5 = 9;
        lVar4 = 0;
        local_40 = (uint *)start;
        do {
          __isoc99_sscanf(sline + iVar5,"%2x",&local_5c);
          ebuf[lVar4 + (int)local_54] = (uint8)local_5c;
          iVar1 = iVar1 + local_5c;
          lVar4 = lVar4 + 1;
          iVar5 = iVar5 + 2;
        } while (lVar4 < local_50);
        lVar4 = (long)iVar5;
        start = (int *)local_40;
        local_48 = (long)(int)local_54;
      }
      iVar5 = local_50;
      iVar2 = __isoc99_sscanf(sline + lVar4,"%2x",&local_5c);
      if (iVar2 == 0) break;
      iVar5 = (iVar5 - local_60) + (int)local_48;
      if (iVar5 <= local_58) {
        iVar5 = local_58;
      }
      local_58 = iVar5;
    } while ((-iVar1 & 0xffU) == local_5c);
    __s = "Invalid checksum.";
LAB_00102584:
    puts(__s);
    iVar1 = 0;
LAB_00102560:
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int input_intelhex(char *fname, int *start, int *length)
{
   FILE *fp;
 
   int c, sc, retval = 1;
   int ll, ladr, lt, sn, i, lval;
   int hstart, hlength, sum;

   fp = fopen(fname, "r");
   if(fp == NULL) 
      return 0;
   hstart = MAXBUF;
   hlength = 0;
   sum = 0;
   do
   {
      memset(sline, 0x00, MAXSLENGTH);
      sc = 0;
      while (((c = fgetc(fp)) != EOF) && (c != 0x0A) && (sc < (MAXSLENGTH -1)))
         sline[sc++] = (uint8)c;
      if ((c != EOF) && ((sc < 11) || (sline[0] != ':')))
      {
         c = EOF;
         retval = 0;
         printf("Invalid Intel Hex format.\n");
      }
      if (c != EOF)
      {
         sn = sscanf(sline , ":%2x%4x%2x", &ll, &ladr, &lt);
         if ((sn == 3) && ((ladr + ll) <= MAXBUF) && (lt == 0))
         {
            sum = ll + (ladr >> 8) + (ladr & 0xff) + lt;
            if(ladr < hstart) hstart = ladr;
            for(i = 0; i < ll ; i++)
            {
               sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
               ebuf[ladr + i] = (uint8)lval;
               sum += (uint8)lval;
            }
            if(((ladr + ll) - hstart) > hlength)
               hlength = (ladr + ll) - hstart;
            sum = (0x100 - sum) & 0xff;
            sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
            if (!sn || ((sum - lval) != 0))
            {
               c = EOF;
               retval = 0;
               printf("Invalid checksum.\n");
            }
         }
      }      
   }
   while (c != EOF);
   if (retval)
   {
      *length = hlength;
      *start = hstart;
   }
   fclose(fp);
   
   return retval;
}